

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

void __thiscall METADemuxer::openFile(METADemuxer *this,string *streamName)

{
  int iVar1;
  pointer pcVar2;
  pointer pSVar3;
  AbstractStreamReader *pAVar4;
  bool bVar5;
  METADemuxer *this_00;
  bool bVar6;
  ulong uVar7;
  mapped_type *this_01;
  long lVar8;
  pointer pSVar9;
  undefined4 *puVar10;
  iterator __begin2;
  ulong uVar11;
  pointer pSVar12;
  string codecStreamName;
  string str;
  string codec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  TextFile file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  addParams;
  string local_2b8;
  string local_298;
  string local_278;
  METADemuxer *local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  string local_238;
  uint *local_218;
  undefined8 local_210;
  uint local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  File local_1e0;
  undefined1 local_1a8 [32];
  _Base_ptr local_188;
  size_t local_180;
  
  std::__cxx11::string::_M_assign((string *)&this->m_streamName);
  readClose(this);
  local_258 = this;
  File::File(&local_1e0,(this->m_streamName)._M_dataplus._M_p,1,0);
  local_1e0.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream =
       (AbstractStream)&PTR__File_0023ddc8;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  TextFile::readLine((TextFile *)&local_1e0,&local_298);
  if (local_298._M_string_length != 0) {
    do {
      trimStr((string *)local_1a8,&local_298);
      std::__cxx11::string::operator=((string *)&local_298,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((local_298._M_string_length == 0) || (*local_298._M_dataplus._M_p == '#')) {
LAB_001a240b:
        TextFile::readLine((TextFile *)&local_1e0,&local_298);
      }
      else {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"MUXOPT","");
        bVar6 = strStartWith(&local_298,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (bVar6) goto LAB_001a240b;
        splitQuotedStr_abi_cxx11_(&local_250,local_298._M_dataplus._M_p,',');
        if ((ulong)((long)local_250.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_250.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Invalid codec format: ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
          puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar10 = 0x1f6;
          *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
          if (local_218 == &local_208) {
            puVar10[6] = local_208;
            puVar10[7] = uStack_204;
            puVar10[8] = uStack_200;
            puVar10[9] = uStack_1fc;
          }
          else {
            *(uint **)(puVar10 + 2) = local_218;
            *(ulong *)(puVar10 + 6) = CONCAT44(uStack_204,local_208);
          }
          *(undefined8 *)(puVar10 + 4) = local_210;
          local_210 = 0;
          local_208 = local_208 & 0xffffff00;
          local_218 = &local_208;
          __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        local_1a8._8_4_ = _S_red;
        local_1a8._16_8_ = 0;
        local_1a8._24_8_ = local_1a8 + 8;
        local_180 = 0;
        local_188 = (_Base_ptr)local_1a8._24_8_;
        if (0x40 < (ulong)((long)local_250.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_250.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          uVar7 = 2;
          uVar11 = 3;
          do {
            splitStr_abi_cxx11_(&local_1f8,
                                local_250.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p,
                                '=');
            if ((ulong)((long)local_1f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
            }
            else {
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              pcVar2 = local_1f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b8,pcVar2,
                         pcVar2 + local_1f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
            }
            trimStr(&local_278,&local_2b8);
            trimStr(&local_238,
                    local_1f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_1a8,&local_238);
            std::__cxx11::string::operator=((string *)this_01,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1f8);
            bVar6 = uVar11 < (ulong)((long)local_250.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_250.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar7 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar6);
        }
        trimStr(&local_278,
                local_250.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
        trimStr(&local_2b8,
                local_250.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
        strToUpperCase(&local_238,&local_278);
        std::__cxx11::string::operator=((string *)&local_278,(string *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_258;
        if (local_258->m_HevcFound == false) {
          lVar8 = std::__cxx11::string::find((char *)&local_278,0x2041b4,0);
          this_00->m_HevcFound = lVar8 == 0xc;
        }
        addStream(this_00,&local_278,&local_2b8,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1a8);
        TextFile::readLine((TextFile *)&local_1e0,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_250);
      }
    } while (local_298._M_string_length != 0);
  }
  pSVar12 = (local_258->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (local_258->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar9 = pSVar12;
  do {
    if (pSVar9 == pSVar3) {
LAB_001a2716:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      File::~File(&local_1e0);
      return;
    }
    pAVar4 = pSVar9->m_streamReader;
    if (((pAVar4 != (AbstractStreamReader *)0x0) &&
        ((pAVar4->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader ==
         (_func_int **)&PTR__H264StreamReader_0023d850)) &&
       (*(char *)((long)&pAVar4[5].m_tmpBufferLen + 2) != '\x01')) {
      iVar1 = *(int *)((long)&pAVar4[3].m_buffer + 4);
      if (iVar1 != 3) {
        bVar6 = false;
        do {
          pAVar4 = pSVar12->m_streamReader;
          if (((pAVar4 != (AbstractStreamReader *)0x0) &&
              ((pAVar4->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader ==
               (_func_int **)&PTR__H264StreamReader_0023d850)) &&
             (*(char *)((long)&pAVar4[5].m_tmpBufferLen + 2) == '\x01')) {
            bVar5 = !bVar6;
            bVar6 = true;
            if (bVar5) {
              if (*(int *)((long)&pAVar4[3].m_buffer + 4) == iVar1) {
                bVar6 = false;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "Parameter \'insertSEI\' for MVC dependent view differs from same param for AVC base view. Ignore and apply same value"
                           ,0x73);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                std::ostream::put(-0x28);
                std::ostream::flush();
                sLastMsg = true;
              }
            }
            *(int *)((long)&pAVar4[3].m_buffer + 4) = iVar1;
          }
          pSVar12 = pSVar12 + 1;
        } while (pSVar12 != pSVar3);
      }
      goto LAB_001a2716;
    }
    pSVar9 = pSVar9 + 1;
  } while( true );
}

Assistant:

void METADemuxer::openFile(const string& streamName)
{
    m_streamName = streamName;
    readClose();

    TextFile file(m_streamName.c_str(), File::ofRead);
    string str;
    file.readLine(str);
    while (str.length() > 0)
    {
        str = trimStr(str);
        if (str.length() == 0 || str[0] == '#')
        {
            file.readLine(str);
            continue;
        }
        if (strStartWith(str, "MUXOPT"))
        {
            file.readLine(str);
            continue;
        }
        vector<string> params = splitQuotedStr(str.c_str(), ',');
        if (params.size() < 2)
            THROW(ERR_INVALID_CODEC_FORMAT, "Invalid codec format: " << str)
        map<string, string> addParams;
        for (unsigned i = 2; i < params.size(); i++)
        {
            // params[i] = strToLowerCase ( params[i] );
            vector<string> tmp = splitStr(params[i].c_str(), '=');
            addParams[trimStr(tmp[0])] = trimStr(tmp.size() > 1 ? tmp[1] : "");
        }
        string codec = trimStr(params[0]);
        string codecStreamName = trimStr(params[1]);
        codec = strToUpperCase(codec);
        if (!m_HevcFound)
            m_HevcFound = (codec.find("HEVC") == 12);
        addStream(codec, codecStreamName, addParams);
        file.readLine(str);
    }

    auto primarySEI = H264StreamReader::SeiMethod::SEI_NotDefined;
    for (const auto& si : m_codecInfo)
    {
        const auto reader = dynamic_cast<H264StreamReader*>(si.m_streamReader);
        if (reader && !reader->isSubStream())
        {
            primarySEI = reader->getInsertSEI();
            break;
        }
    }

    if (primarySEI != H264StreamReader::SeiMethod::SEI_NotDefined)
    {
        bool warned = false;
        for (const auto& i : m_codecInfo)
        {
            const auto reader = dynamic_cast<H264StreamReader*>(i.m_streamReader);
            if (reader && reader->isSubStream())
            {
                if (!warned && reader->getInsertSEI() != primarySEI)
                {
                    LTRACE(LT_INFO, 2,
                           "Parameter 'insertSEI' for MVC dependent view differs from same param for AVC base view. "
                           "Ignore and apply same value");
                    warned = true;
                }
                reader->setInsertSEI(primarySEI);
            }
        }
    }
}